

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O1

void __thiscall jrtplib::RTCPCompoundPacketBuilder::Report::Clear(Report *this)

{
  RTPMemoryManager *pRVar1;
  _List_node_base *p_Var2;
  
  for (p_Var2 = (this->reportblocks).
                super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->reportblocks; p_Var2 = p_Var2->_M_next) {
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      pRVar1 = (this->super_RTPMemoryObject).mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        operator_delete__(p_Var2[1]._M_next);
      }
      else {
        (**(code **)(*(long *)pRVar1 + 0x18))();
      }
    }
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(&this->reportblocks);
  this->isSR = false;
  this->headerlength = 0;
  return;
}

Assistant:

void Clear()
		{
			std::list<Buffer>::const_iterator it; 
			for (it = reportblocks.begin() ; it != reportblocks.end() ; it++) 
			{
				if ((*it).packetdata) 
					RTPDeleteByteArray((*it).packetdata,GetMemoryManager()); 
			}
			reportblocks.clear();
			isSR = false;
			headerlength = 0;
		}